

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsystemtrayicon_x11.cpp
# Opt level: O2

void __thiscall
QSystemTrayIconSys::QSystemTrayIconSys(QSystemTrayIconSys *this,QSystemTrayIcon *qIn)

{
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_60;
  QArrayDataPointer<char16_t> local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  QWidget::QWidget((QWidget *)this,(QWidget *)0x0,(WindowFlags)0xc01);
  *(undefined ***)this = &PTR_metaObject_007f0470;
  *(undefined ***)(this + 0x10) = &PTR__QSystemTrayIconSys_007f0620;
  *(QSystemTrayIcon **)(this + 0x28) = qIn;
  local_48.d = (Data *)0x0;
  local_60.d = (Data *)0x0;
  local_60.ptr = (char16_t *)0x0;
  local_48.ptr = L"QSystemTrayIconSys";
  local_60.size = 0;
  local_48.size = 0x12;
  QObject::doSetObjectName((QString *)this);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_60);
  QSystemTrayIcon::toolTip((QString *)&local_48,*(QSystemTrayIcon **)(this + 0x28));
  QWidget::setToolTip((QWidget *)this,(QString *)&local_48);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
  QWidget::setAttribute((QWidget *)this,WA_AlwaysShowToolTips,true);
  QWidget::setAttribute((QWidget *)this,WA_QuitOnClose,false);
  local_60.d = (Data *)0x1600000016;
  local_48.d = (Data *)0x0;
  local_48.ptr = (char16_t *)0x1500000015;
  QWidget::setGeometry((QWidget *)this,(QRect *)&local_48);
  QWidget::setMinimumSize((QWidget *)this,(QSize *)&local_60);
  QWidget::setAttribute((QWidget *)this,WA_TranslucentBackground,true);
  QWidget::setMouseTracking((QWidget *)this,true);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QSystemTrayIconSys::QSystemTrayIconSys(QSystemTrayIcon *qIn)
    : QWidget(nullptr, Qt::Window | Qt::FramelessWindowHint | Qt::BypassWindowManagerHint)
    , q(qIn)
{
    setObjectName(QStringLiteral("QSystemTrayIconSys"));
#if QT_CONFIG(tooltip)
    setToolTip(q->toolTip());
#endif
    setAttribute(Qt::WA_AlwaysShowToolTips, true);
    setAttribute(Qt::WA_QuitOnClose, false);
    const QSize size(22, 22); // Gnome, standard size
    setGeometry(QRect(QPoint(0, 0), size));
    setMinimumSize(size);
    setAttribute(Qt::WA_TranslucentBackground);
    setMouseTracking(true);
}